

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edge_detection.cpp
# Opt level: O2

void anon_unknown.dwarf_899df::findEdgePoints<float>
               (vector<float,_std::allocator<float>_> *positive,
               vector<float,_std::allocator<float>_> *negative,
               vector<int,_std::allocator<int>_> *data,vector<int,_std::allocator<int>_> *first,
               vector<int,_std::allocator<int>_> *second,EdgeParameter *edgeParameter,
               bool forwardDirection)

{
  edgeType eVar1;
  bool bVar2;
  
  getDerivatives(data,first,second);
  getEdgePoints<float>(positive,data,first,second,edgeParameter);
  removeSimilarPoints<float>(positive);
  std::__reverse<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start,(data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish);
  getDerivatives(data,first,second);
  getEdgePoints<float>(negative,data,first,second,edgeParameter);
  removeSimilarPoints<float>(negative);
  eVar1 = edgeParameter->edge;
  if ((forwardDirection && eVar1 == FIRST) || ((eVar1 == LAST & ~forwardDirection) == 1)) {
    leaveFirstElement<float>(positive);
    leaveLastElement<float>(negative);
    return;
  }
  bVar2 = eVar1 == FIRST;
  if (forwardDirection) {
    bVar2 = eVar1 == LAST;
  }
  if (bVar2) {
    leaveLastElement<float>(positive);
    leaveFirstElement<float>(negative);
    return;
  }
  return;
}

Assistant:

void findEdgePoints( std::vector < _Type > & positive, std::vector < _Type > & negative, std::vector < int > & data,
                         std::vector < int > & first, std::vector < int > & second, const EdgeParameter & edgeParameter, bool forwardDirection )
    {
        getDerivatives( data, first, second );
        getEdgePoints( positive, data, first, second, edgeParameter );
        removeSimilarPoints( positive );

        std::reverse( data.begin(), data.end() );
        getDerivatives( data, first, second );
        getEdgePoints( negative, data, first, second, edgeParameter );
        removeSimilarPoints( negative );
        if ( (forwardDirection && edgeParameter.edge == EdgeParameter::FIRST) || (!forwardDirection && edgeParameter.edge == EdgeParameter::LAST) ) {
            leaveFirstElement( positive );
            leaveLastElement( negative );
        }
        else if ( (forwardDirection && edgeParameter.edge == EdgeParameter::LAST) || (!forwardDirection && edgeParameter.edge == EdgeParameter::FIRST) ) {
            leaveLastElement( positive );
            leaveFirstElement( negative );
        }
    }